

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# romfs.cpp
# Opt level: O1

ssize_t __thiscall
pstore::romfs::open_file::read(open_file *this,int __fd,void *__buf,size_t __nbytes)

{
  void *pvVar1;
  ulong uVar2;
  size_t sVar3;
  long lVar4;
  undefined4 in_register_00000034;
  size_t sVar5;
  
  if (__nbytes == 0 || __buf == (void *)0x0) {
    __nbytes = 0;
  }
  else {
    pvVar1 = (this->dir_->contents_).ptr_;
    uVar2 = (this->dir_->stat_).size;
    sVar3 = this->pos_;
    lVar4 = 0;
    sVar5 = 0;
    do {
      if (uVar2 < this->pos_ + (long)__buf) {
        return sVar5;
      }
      memcpy((void *)(CONCAT44(in_register_00000034,__fd) + lVar4),
             (void *)((long)pvVar1 + lVar4 + sVar3),(size_t)__buf);
      this->pos_ = this->pos_ + (long)__buf;
      sVar5 = sVar5 + 1;
      lVar4 = lVar4 + (long)__buf;
    } while (__nbytes != sVar5);
  }
  return __nbytes;
}

Assistant:

std::size_t open_file::read (not_null<void *> const b, std::size_t const size,
                                     std::size_t const count) {
            if (size == 0 || count == 0) {
                return 0;
            }
            auto const file_size =
                std::make_unsigned<off_t>::type (std::max (dir_.stat ().size, std::size_t{0}));
            auto num_read = std::size_t{0};
            auto const * start =
                reinterpret_cast<std::uint8_t const *> (dir_.contents ().get ()) + pos_;
            void * buffer = b;
            for (; num_read < count; ++num_read) {
                if (pos_ + size > file_size) {
                    return num_read;
                }
                std::memcpy (buffer, start, size);
                start += size;
                buffer = reinterpret_cast<std::uint8_t *> (buffer) + size;
                pos_ += size;
            }
            return num_read;
        }